

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  sqlite3 *db;
  Mem *pMVar1;
  sqlite3 **ppsVar2;
  uint uVar3;
  
  db = p->db;
  if (p->nResColumn != 0) {
    releaseMemArray(p->aColName,(uint)p->nResColumn * 2);
    if (p->aColName != (Mem *)0x0) {
      sqlite3DbFreeNN(db,p->aColName);
    }
  }
  p->nResColumn = (u16)nResColumn;
  pMVar1 = (Mem *)sqlite3DbMallocRawNN(db,(long)(nResColumn * 2) * 0x38);
  p->aColName = pMVar1;
  if (0 < nResColumn && pMVar1 != (Mem *)0x0) {
    ppsVar2 = &pMVar1->db;
    uVar3 = nResColumn * 2 + 1;
    do {
      *ppsVar2 = db;
      *(u16 *)(ppsVar2 + -4) = 1;
      *(int *)(ppsVar2 + -1) = 0;
      ppsVar2 = ppsVar2 + 7;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResColumn ){
    releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}